

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb-test.cpp
# Opt level: O2

long __thiscall
cubeb_client::user_data_cb
          (cubeb_client *this,cubeb_stream *stm,void *user,void *input_buffer,void *output_buffer,
          long nframes)

{
  uint32_t uVar1;
  uint32_t j;
  uint uVar2;
  long lVar3;
  uint32_t i;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  int local_68;
  
  local_68 = (int)nframes;
  if (output_buffer == (void *)0x0 || input_buffer == (void *)0x0) {
    if (output_buffer != (void *)0x0 && input_buffer == (void *)0x0) {
      uVar2 = (this->_channels).super___atomic_base<unsigned_int>._M_i;
      uVar1 = this->_total_frames;
      dVar11 = (double)(this->_rate).super___atomic_base<unsigned_int>._M_i;
      uVar6 = 0;
      for (iVar4 = 0; iVar4 != local_68; iVar4 = iVar4 + 1) {
        dVar13 = (double)(uVar1 + iVar4) * 6.283185307179586;
        uVar8 = (ulong)uVar2;
        uVar5 = uVar6;
        while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
          dVar12 = sin((dVar13 * 350.0) / dVar11);
          uVar9 = (ulong)uVar5;
          *(float *)((long)output_buffer + uVar9 * 4) = (float)(dVar12 * 0.2);
          dVar12 = sin((dVar13 * 440.0) / dVar11);
          *(float *)((long)output_buffer + uVar9 * 4) =
               (float)(dVar12 * 0.2 + (double)*(float *)((long)output_buffer + uVar9 * 4));
          uVar5 = uVar5 + 1;
        }
        uVar6 = uVar6 + uVar2;
      }
    }
  }
  else if (((this->_latency_testing)._M_base._M_i & 1U) == 0) {
    lVar7 = 0;
    lVar3 = 0;
    if (0 < nframes) {
      lVar3 = nframes;
    }
    for (; lVar7 != lVar3; lVar7 = lVar7 + 1) {
      for (uVar2 = 0; uVar2 < (this->_channels).super___atomic_base<unsigned_int>._M_i;
          uVar2 = uVar2 + 1) {
        *(undefined4 *)
         ((long)output_buffer +
         (ulong)((this->_channels).super___atomic_base<unsigned_int>._M_i * (int)lVar7 + uVar2) * 4)
             = *(undefined4 *)((long)input_buffer + lVar7 * 4);
      }
    }
  }
  else {
    lVar7 = 0;
    lVar3 = 0;
    if (0 < nframes) {
      lVar3 = nframes;
    }
    for (; lVar7 != lVar3; lVar7 = lVar7 + 1) {
      iVar4 = (int)lVar7;
      uVar2 = 0;
      if ((this->_total_frames + iVar4) % (this->_rate).super___atomic_base<unsigned_int>._M_i == 0)
      {
        for (; uVar2 < (this->_channels).super___atomic_base<unsigned_int>._M_i; uVar2 = uVar2 + 1)
        {
          *(float *)((long)output_buffer +
                    (ulong)((this->_channels).super___atomic_base<unsigned_int>._M_i * iVar4 + uVar2
                           ) * 4) = *(float *)((long)input_buffer + lVar7 * 4) * 0.5 + 1.0;
        }
      }
      else {
        for (; uVar2 < (this->_channels).super___atomic_base<unsigned_int>._M_i; uVar2 = uVar2 + 1)
        {
          *(float *)((long)output_buffer +
                    (ulong)((this->_channels).super___atomic_base<unsigned_int>._M_i * iVar4 + uVar2
                           ) * 4) = *(float *)((long)input_buffer + lVar7 * 4) * 0.5 + 0.0;
        }
      }
    }
  }
  this->_total_frames = this->_total_frames + local_68;
  return nframes - (ulong)((this->_force_drain)._M_base._M_i & 1);
}

Assistant:

long cubeb_client::user_data_cb(cubeb_stream* stm, void* user,
                                const void* input_buffer, void* output_buffer,
                                long nframes) {
  if (input_buffer && output_buffer) {
    const float* in = static_cast<const float*>(input_buffer);
    float* out = static_cast<float*>(output_buffer);
    if (_latency_testing) {
      for (int32_t i = 0; i < nframes; i++) {
        // Impulses every second, mixed with the input signal fed back at half
        // gain, to measure the input-to-output latency via feedback.
        uint32_t clock = ((_total_frames + i) % _rate);
        if (!clock) {
          for (uint32_t j = 0; j < _channels; j++) {
            out[i * _channels + j] = 1.0 + in[i] * 0.5;
          }
        } else {
          for (uint32_t j = 0; j < _channels; j++) {
            out[i * _channels + j] = 0.0 + in[i] * 0.5;
          }
        }
      }
    } else {
      for (int32_t i = 0; i < nframes; i++) {
        for (uint32_t j = 0; j < _channels; j++) {
          out[i * _channels + j] = in[i];
        }
      }
    }
  } else if (output_buffer && !input_buffer) {
    fill_with_sine_tone(static_cast<float*>(output_buffer), nframes, _channels,
                       _rate, _total_frames);
  }

  _total_frames += nframes;

  if (_force_drain) {
    return nframes - 1;
  }

  return nframes;
}